

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O0

void ex_atan2(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  long lVar2;
  t_float *ptVar3;
  ex_ex *peVar4;
  double dVar5;
  int local_58;
  int j;
  t_float scalar;
  t_float *rp;
  t_float *lp;
  t_float *op;
  ex_ex *right;
  ex_ex *left;
  ex_ex *optr_local;
  ex_ex *argv_local;
  long argc_local;
  t_expr *e_local;
  
  peVar4 = argv + 1;
  switch(argv->ex_type) {
  case 1:
    switch(argv[1].ex_type) {
    case 1:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        dVar5 = atan2((double)(argv->ex_cont).v_int,(double)(peVar4->ex_cont).v_int);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)dVar5;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        dVar5 = atan2((double)(argv->ex_cont).v_int,(double)(peVar4->ex_cont).v_int);
        (optr->ex_cont).v_flt = (float)dVar5;
      }
      break;
    case 2:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        dVar5 = atan2((double)(argv->ex_cont).v_int,(double)(peVar4->ex_cont).v_flt);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)dVar5;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        dVar5 = atan2((double)(argv->ex_cont).v_int,(double)(peVar4->ex_cont).v_flt);
        (optr->ex_cont).v_flt = (float)dVar5;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x315,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) {
          post("expr~: Int. error %d",0x315);
          abort();
        }
        optr->ex_type = 0xf;
        ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar3;
      }
      lVar2 = (argv->ex_cont).v_int;
      _j = (peVar4->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      lp = (optr->ex_cont).v_vec;
      while (local_58 != 0) {
        dVar5 = atan2((double)lVar2,(double)*_j);
        *lp = (float)dVar5;
        _j = _j + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
    break;
  case 2:
    switch(argv[1].ex_type) {
    case 1:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        dVar5 = atan2((double)(argv->ex_cont).v_flt,(double)(peVar4->ex_cont).v_int);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)dVar5;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        dVar5 = atan2((double)(argv->ex_cont).v_flt,(double)(peVar4->ex_cont).v_int);
        (optr->ex_cont).v_flt = (float)dVar5;
      }
      break;
    case 2:
      if (optr->ex_type == 0xf) {
        lp = (optr->ex_cont).v_vec;
        dVar5 = atan2((double)(argv->ex_cont).v_flt,(double)(peVar4->ex_cont).v_flt);
        local_58 = e->exp_vsize;
        while (local_58 != 0) {
          *lp = (float)dVar5;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        dVar5 = atan2((double)(argv->ex_cont).v_flt,(double)(peVar4->ex_cont).v_flt);
        (optr->ex_cont).v_flt = (float)dVar5;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x315,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) {
          post("expr~: Int. error %d",0x315);
          abort();
        }
        optr->ex_type = 0xf;
        ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar3;
      }
      fVar1 = (argv->ex_cont).v_flt;
      _j = (peVar4->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      lp = (optr->ex_cont).v_vec;
      while (local_58 != 0) {
        dVar5 = atan2((double)fVar1,(double)*_j);
        *lp = (float)dVar5;
        _j = _j + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
    break;
  case 7:
  default:
    pd_error(e,"expr: FUNC_EVAL(%d): bad left type %ld\n",0x315,argv->ex_type);
    break;
  case 0xe:
  case 0xf:
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
        post("expr~: Int. error %d",0x315);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar3;
    }
    lp = (optr->ex_cont).v_vec;
    rp = (argv->ex_cont).v_vec;
    switch(argv[1].ex_type) {
    case 1:
      lVar2 = (peVar4->ex_cont).v_int;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        dVar5 = atan2((double)*rp,(double)lVar2);
        *lp = (float)dVar5;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
      break;
    case 2:
      fVar1 = (peVar4->ex_cont).v_flt;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        dVar5 = atan2((double)*rp,(double)fVar1);
        *lp = (float)dVar5;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x315,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      _j = (peVar4->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        dVar5 = atan2((double)*rp,(double)*_j);
        *lp = (float)dVar5;
        _j = _j + 1;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
  }
  return;
}

Assistant:

static void
ex_atan2(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, atan2, (double), (double), optr, 1);
}